

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureType::InternalSwap
          (ArrayFeatureType *this,ArrayFeatureType *other)

{
  ArrayFeatureType *other_local;
  ArrayFeatureType *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<long>::InternalSwap(&this->shape_,&other->shape_);
  std::swap<int>(&this->datatype_,&other->datatype_);
  std::swap<CoreML::Specification::ArrayFeatureType::ShapeFlexibilityUnion>
            (&this->ShapeFlexibility_,&other->ShapeFlexibility_);
  std::swap<CoreML::Specification::ArrayFeatureType::DefaultOptionalValueUnion>
            (&this->defaultOptionalValue_,&other->defaultOptionalValue_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  std::swap<unsigned_int>(this->_oneof_case_ + 1,other->_oneof_case_ + 1);
  return;
}

Assistant:

void ArrayFeatureType::InternalSwap(ArrayFeatureType* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shape_.InternalSwap(&other->shape_);
  swap(datatype_, other->datatype_);
  swap(ShapeFlexibility_, other->ShapeFlexibility_);
  swap(defaultOptionalValue_, other->defaultOptionalValue_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
  swap(_oneof_case_[1], other->_oneof_case_[1]);
}